

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  bool local_bba;
  bool local_b5a;
  bool local_aca;
  bool local_a6a;
  string local_a40;
  string_view local_a20;
  string *local_a10;
  string *actual;
  string emulatedId;
  string emulated;
  string version;
  allocator<char> local_991;
  string local_990;
  string_view local_970;
  allocator<char> local_959;
  string local_958;
  string_view local_938;
  allocator<char> local_921;
  string local_920;
  string_view local_900;
  string local_8f0;
  string local_8d0;
  undefined1 local_8b0 [8];
  ostringstream w_3;
  allocator<char> local_731;
  string local_730;
  string local_710;
  string_view local_6f0;
  string local_6e0;
  string local_6c0;
  undefined1 local_6a0 [8];
  ostringstream w_2;
  allocator<char> local_521;
  string local_520;
  string local_500;
  string_view local_4e0;
  allocator<char> local_4c9;
  string local_4c8;
  string_view local_4a8;
  allocator<char> local_491;
  string local_490;
  string_view local_470;
  string local_460;
  string local_440;
  undefined1 local_420 [8];
  ostringstream w_1;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  string_view local_260;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  ostringstream w;
  allocator<char> local_91;
  string local_90;
  undefined1 local_60 [8];
  string compilerId;
  string compilerIdVar;
  string *lang_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  psVar3 = (string *)((long)&compilerId.field_2 + 8);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (psVar3,(char (*) [7])0x1244722,lang,(char (*) [13])0x12498d8);
  psVar3 = cmMakefile::GetSafeDefinition(mf,psVar3);
  std::__cxx11::string::string((string *)local_60,(string *)psVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"AppleClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_a6a = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"CMAKE_POLICY_WARNING_CMP0025",&local_91);
        local_a6a = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      if (local_a6a != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_230,(cmPolicies *)0x19,id_00);
        poVar4 = std::operator<<((ostream *)local_210,(string *)&local_230);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)lang);
        std::operator<<(poVar4," compiler id \"AppleClang\" to \"Clang\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_260,"Clang");
      cmMakefile::AddDefinition(mf,(string *)((long)&compilerId.field_2 + 8),local_260);
      break;
    case NEW:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_280,(cmPolicies *)0x19,id);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"QCC");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_aca = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"CMAKE_POLICY_WARNING_CMP0047",&local_2a1);
        local_aca = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
      }
      if (local_aca != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_440,(cmPolicies *)0x2f,id_02);
        poVar4 = std::operator<<((ostream *)local_420,(string *)&local_440);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)lang);
        std::operator<<(poVar4," compiler id \"QCC\" to \"GNU\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_470,"GNU");
      cmMakefile::AddDefinition(mf,(string *)((long)&compilerId.field_2 + 8),local_470);
      bVar1 = std::operator==(lang,"C");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_490,"CMAKE_COMPILER_IS_GNUCC",&local_491);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4a8,"1");
        cmMakefile::AddDefinition(mf,&local_490,local_4a8);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator(&local_491);
      }
      else {
        bVar1 = std::operator==(lang,"CXX");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c8,"CMAKE_COMPILER_IS_GNUCXX",&local_4c9);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4e0,"1");
          cmMakefile::AddDefinition(mf,&local_4c8,local_4e0);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::allocator<char>::~allocator(&local_4c9);
        }
      }
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_500,(cmPolicies *)0x2f,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
    case NEW:
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"XLClang");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_b5a = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_520,"CMAKE_POLICY_WARNING_CMP0089",&local_521);
        local_b5a = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::allocator<char>::~allocator(&local_521);
      }
      if (local_b5a != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6c0,(cmPolicies *)0x59,id_04);
        poVar4 = std::operator<<((ostream *)local_6a0,(string *)&local_6c0);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)lang);
        std::operator<<(poVar4," compiler id \"XLClang\" to \"XL\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_6e0);
        std::__cxx11::string::~string((string *)&local_6e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a0);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6f0,"XL");
      cmMakefile::AddDefinition(mf,(string *)((long)&compilerId.field_2 + 8),local_6f0);
      break;
    case NEW:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_710,(cmPolicies *)0x59,id_03);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_710);
      std::__cxx11::string::~string((string *)&local_710);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"LCC");
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
    switch(PVar2) {
    case WARN:
      bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance);
      local_bba = false;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_730,"CMAKE_POLICY_WARNING_CMP0129",&local_731);
        local_bba = cmMakefile::PolicyOptionalWarningEnabled(mf,&local_730);
        std::__cxx11::string::~string((string *)&local_730);
        std::allocator<char>::~allocator(&local_731);
      }
      if (local_bba != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8b0);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_8d0,(cmPolicies *)0x81,id_06);
        poVar4 = std::operator<<((ostream *)local_8b0,(string *)&local_8d0);
        poVar4 = std::operator<<(poVar4,"\nConverting ");
        poVar4 = std::operator<<(poVar4,(string *)lang);
        std::operator<<(poVar4," compiler id \"LCC\" to \"GNU\" for compatibility.");
        std::__cxx11::string::~string((string *)&local_8d0);
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_8f0);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8b0);
      }
    case OLD:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_900,"GNU");
      cmMakefile::AddDefinition(mf,(string *)((long)&compilerId.field_2 + 8),local_900);
      bVar1 = std::operator==(lang,"C");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_920,"CMAKE_COMPILER_IS_GNUCC",&local_921);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_938,"1");
        cmMakefile::AddDefinition(mf,&local_920,local_938);
        std::__cxx11::string::~string((string *)&local_920);
        std::allocator<char>::~allocator(&local_921);
      }
      else {
        bVar1 = std::operator==(lang,"CXX");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"CMAKE_COMPILER_IS_GNUCXX",&local_959);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_970,"1");
          cmMakefile::AddDefinition(mf,&local_958,local_970);
          std::__cxx11::string::~string((string *)&local_958);
          std::allocator<char>::~allocator(&local_959);
        }
        else {
          bVar1 = std::operator==(lang,"Fortran");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_990,"CMAKE_COMPILER_IS_GNUG77",&local_991);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&version.field_2 + 8),"1");
            cmMakefile::AddDefinition(mf,&local_990,stack0xfffffffffffff658);
            std::__cxx11::string::~string((string *)&local_990);
            std::allocator<char>::~allocator(&local_991);
          }
        }
      }
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
                ((string *)((long)&emulated.field_2 + 8),(char (*) [7])0x1244722,lang,
                 (char (*) [18])0x12498ef);
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
                ((string *)((long)&emulatedId.field_2 + 8),(char (*) [7])0x1244722,lang,
                 (char (*) [18])"_SIMULATE_VERSION");
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
                ((string *)&actual,(char (*) [7])0x1244722,lang,(char (*) [13])0x123a27d);
      local_a10 = cmMakefile::GetRequiredDefinition(mf,(string *)((long)&emulatedId.field_2 + 8));
      local_a20 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a10);
      cmMakefile::AddDefinition(mf,(string *)((long)&emulated.field_2 + 8),local_a20);
      cmMakefile::RemoveDefinition(mf,(string *)&actual);
      cmMakefile::RemoveDefinition(mf,(string *)((long)&emulatedId.field_2 + 8));
      std::__cxx11::string::~string((string *)&actual);
      std::__cxx11::string::~string((string *)(emulatedId.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(emulated.field_2._M_local_buf + 8));
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_a40,(cmPolicies *)0x81,id_05);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_a40);
      std::__cxx11::string::~string((string *)&local_a40);
    case NEW:
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(compilerId.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = cmStrCat("CMAKE_", lang, "_COMPILER_VERSION");
          std::string emulated = cmStrCat("CMAKE_", lang, "_SIMULATE_VERSION");
          std::string emulatedId = cmStrCat("CMAKE_", lang, "_SIMULATE_ID");
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}